

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O1

void absl::lts_20250127::log_internal::RemoveLogSink(LogSink *sink)

{
  LogSink **__src;
  undefined8 uVar1;
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  __dest;
  char *absl_raw_log_internal_filename;
  int local_28 [2];
  char *local_20;
  LogSink *local_18;
  
  anon_unknown_0::GlobalSinks();
  local_18 = sink;
  Mutex::Lock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<absl::lts_20250127::LogSink**,std::vector<absl::lts_20250127::LogSink*,std::allocator<absl::lts_20250127::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<absl::lts_20250127::LogSink*const>>
                     (anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_,
                      anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_,&local_18);
  uVar1 = anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_;
  if (__dest._M_current != (LogSink **)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_
     ) {
    __src = __dest._M_current + 1;
    if (__src != (LogSink **)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_) {
      memmove(__dest._M_current,__src,
              anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_ - (long)__src);
    }
    anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_ =
         anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_ + -8;
  }
  Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
  if (__dest._M_current != (LogSink **)uVar1) {
    return;
  }
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/log/internal/log_sink_set.cc"
  ;
  local_28[1] = 3;
  local_28[0] = 0xe3;
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_28 + 1),
             &local_20,local_28,(char (*) [34])"Mismatched log sink being removed");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/log/internal/log_sink_set.cc"
                ,0xe3,
                "void absl::log_internal::(anonymous namespace)::GlobalLogSinkSet::RemoveLogSink(absl::LogSink *)"
               );
}

Assistant:

void RemoveLogSink(absl::LogSink* sink) {
  log_internal::GlobalSinks().RemoveLogSink(sink);
}